

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

uLong deflateBound(z_streamp_conflict strm,uLong sourceLen)

{
  Bytef BVar1;
  uint uVar2;
  internal_state_conflict *piVar3;
  gz_headerp pgVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Bytef *pBVar8;
  ulong uStack_8;
  
  lVar5 = (sourceLen + 7 >> 3) + sourceLen;
  uVar6 = sourceLen + 0x3f >> 6;
  if ((strm == (z_streamp_conflict)0x0) ||
     (piVar3 = strm->state, piVar3 == (internal_state_conflict *)0x0)) {
    return lVar5 + uVar6 + 0xb;
  }
  uVar2 = piVar3->wrap;
  uStack_8 = (ulong)uVar2;
  if ((ulong)uVar2 != 0) {
    if (uVar2 == 2) {
      pgVar4 = piVar3->gzhead;
      if (pgVar4 == (gz_headerp)0x0) {
        uStack_8 = 0x12;
      }
      else {
        if (pgVar4->extra == (Bytef *)0x0) {
          uVar7 = 0x12;
        }
        else {
          uVar7 = (ulong)(pgVar4->extra_len + 2) + 0x12;
        }
        pBVar8 = pgVar4->name;
        if (pBVar8 != (Bytef *)0x0) {
          do {
            uVar7 = uVar7 + 1;
            BVar1 = *pBVar8;
            pBVar8 = pBVar8 + 1;
          } while (BVar1 != '\0');
        }
        pBVar8 = pgVar4->comment;
        if (pBVar8 != (Bytef *)0x0) {
          do {
            uVar7 = uVar7 + 1;
            BVar1 = *pBVar8;
            pBVar8 = pBVar8 + 1;
          } while (BVar1 != '\0');
        }
        uStack_8 = uVar7 + 2;
        if (pgVar4->hcrc == 0) {
          uStack_8 = uVar7;
        }
      }
    }
    else if (uVar2 == 1) {
      uStack_8 = (ulong)(piVar3->strstart != 0) * 4 + 6;
    }
    else {
      uStack_8 = 6;
    }
  }
  if ((piVar3->w_bits == 0xf) && (piVar3->hash_bits == 0xf)) {
    return sourceLen + 7 + (sourceLen >> 0xc) + (sourceLen >> 0x19) + (sourceLen >> 0xe) + uStack_8;
  }
  return lVar5 + uVar6 + 5 + uStack_8;
}

Assistant:

uLong ZEXPORT deflateBound(z_streamp strm, uLong sourceLen)
{
    deflate_state *s;
    uLong complen, wraplen;
    Bytef *str;

    /* conservative upper bound for compressed data */
    complen = sourceLen +
              ((sourceLen + 7) >> 3) + ((sourceLen + 63) >> 6) + 5;

    /* if can't get parameters, return conservative bound plus zlib wrapper */
    if (strm == Z_NULL || strm->state == Z_NULL)
        return complen + 6;

    /* compute wrapper length */
    s = strm->state;
    switch (s->wrap) {
    case 0:                                 /* raw deflate */
        wraplen = 0;
        break;
    case 1:                                 /* zlib wrapper */
        wraplen = 6 + (s->strstart ? 4 : 0);
        break;
    case 2:                                 /* gzip wrapper */
        wraplen = 18;
        if (s->gzhead != Z_NULL) {          /* user-supplied gzip header */
            if (s->gzhead->extra != Z_NULL)
                wraplen += 2 + s->gzhead->extra_len;
            str = s->gzhead->name;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            str = s->gzhead->comment;
            if (str != Z_NULL)
                do {
                    wraplen++;
                } while (*str++);
            if (s->gzhead->hcrc)
                wraplen += 2;
        }
        break;
    default:                                /* for compiler happiness */
        wraplen = 6;
    }

    /* if not default parameters, return conservative bound */
    if (s->w_bits != 15 || s->hash_bits != 8 + 7)
        return complen + wraplen;

    /* default settings: return tight bound for that case */
    return sourceLen + (sourceLen >> 12) + (sourceLen >> 14) +
           (sourceLen >> 25) + 13 - 6 + wraplen;
}